

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

U64 ZSTD_getCParamRowSize(U64 srcSizeHint,size_t dictSize,ZSTD_cParamMode_e mode)

{
  int iVar1;
  U64 local_38;
  size_t addedSize;
  int unknown;
  ZSTD_cParamMode_e mode_local;
  size_t dictSize_local;
  U64 srcSizeHint_local;
  
  _unknown = dictSize;
  if (mode != ZSTD_cpm_noAttachDict) {
    if (mode == ZSTD_cpm_attachDict) {
      _unknown = 0;
    }
    else if (mode != ZSTD_cpm_createCDict && mode != ZSTD_cpm_unknown) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x1b21,"U64 ZSTD_getCParamRowSize(U64, size_t, ZSTD_cParamMode_e)");
    }
  }
  iVar1 = 0;
  if (srcSizeHint == 0xffffffffffffffff && _unknown != 0) {
    iVar1 = 500;
  }
  if ((srcSizeHint == 0xffffffffffffffff) && (_unknown == 0)) {
    local_38 = 0xffffffffffffffff;
  }
  else {
    local_38 = srcSizeHint + _unknown + (long)iVar1;
  }
  return local_38;
}

Assistant:

static U64 ZSTD_getCParamRowSize(U64 srcSizeHint, size_t dictSize, ZSTD_cParamMode_e mode)
{
    switch (mode) {
    case ZSTD_cpm_unknown:
    case ZSTD_cpm_noAttachDict:
    case ZSTD_cpm_createCDict:
        break;
    case ZSTD_cpm_attachDict:
        dictSize = 0;
        break;
    default:
        assert(0);
        break;
    }
    {   int const unknown = srcSizeHint == ZSTD_CONTENTSIZE_UNKNOWN;
        size_t const addedSize = unknown && dictSize > 0 ? 500 : 0;
        return unknown && dictSize == 0 ? ZSTD_CONTENTSIZE_UNKNOWN : srcSizeHint+dictSize+addedSize;
    }
}